

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O2

UniquePtr<CRYPTO_BUFFER> __thiscall bssl::x509_to_buffer(bssl *this,X509 *x509)

{
  uint uVar1;
  CRYPTO_BUFFER *pCVar2;
  uint8_t *buf;
  uint8_t *local_18;
  
  local_18 = (uint8_t *)0x0;
  uVar1 = i2d_X509(x509,&local_18);
  if ((int)uVar1 < 1) {
    *(undefined8 *)this = 0;
  }
  else {
    pCVar2 = CRYPTO_BUFFER_new(local_18,(ulong)uVar1,(CRYPTO_BUFFER_POOL *)0x0);
    *(CRYPTO_BUFFER **)this = pCVar2;
    OPENSSL_free(local_18);
  }
  return (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static UniquePtr<CRYPTO_BUFFER> x509_to_buffer(X509 *x509) {
  uint8_t *buf = NULL;
  int cert_len = i2d_X509(x509, &buf);
  if (cert_len <= 0) {
    return 0;
  }

  UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new(buf, cert_len, NULL));
  OPENSSL_free(buf);

  return buffer;
}